

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O0

bool __thiscall HEkkDual::checkNonUnitWeightError(HEkkDual *this,string *message)

{
  long lVar1;
  reference pvVar2;
  undefined8 uVar3;
  long in_RDI;
  HighsInt iRow;
  double unit_wt_error;
  vector<double,_std::allocator<double>_> *edge_weight;
  bool error_found;
  int local_2c;
  double local_28;
  bool local_11;
  
  local_11 = false;
  if (*(int *)(in_RDI + 0xac) == 0) {
    lVar1 = *(long *)(in_RDI + 0x10);
    local_28 = 0.0;
    for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x18); local_2c = local_2c + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x2a20),(long)local_2c
                         );
      local_28 = ABS(*pvVar2 - 1.0) + local_28;
    }
    local_11 = 0.0001 < local_28;
    if (local_11) {
      uVar3 = std::__cxx11::string::c_str();
      printf("Non-unit Edge weight error of %g: %s\n",local_28,uVar3);
    }
  }
  return local_11;
}

Assistant:

bool HEkkDual::checkNonUnitWeightError(std::string message) {
  bool error_found = false;
  if (edge_weight_mode == EdgeWeightMode::kDantzig) {
    std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
    double unit_wt_error = 0;
    for (HighsInt iRow = 0; iRow < solver_num_row; iRow++) {
      unit_wt_error += fabs(edge_weight[iRow] - 1.0);
    }
    error_found = unit_wt_error > 1e-4;
    if (error_found)
      printf("Non-unit Edge weight error of %g: %s\n", unit_wt_error,
             message.c_str());
  }
  return error_found;
}